

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedmatting.cpp
# Opt level: O2

double __thiscall SharedMatting::aP(SharedMatting *this,int i,int j,double pf,Scalar *f,Scalar *b)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  SharedMatting *this_00;
  double dVar4;
  Matx<double,_4,_1> local_a8;
  undefined1 local_80 [64];
  Scalar local_40;
  
  lVar3 = (long)(j * this->channels + i * this->step);
  bVar1 = this->data[lVar3 + 2];
  uVar2 = *(ushort *)(this->data + lVar3);
  cv::Matx<double,_4,_1>::Matx(&local_a8);
  local_a8.val[3] = 0.0;
  local_a8.val[0] = (double)(uVar2 & 0xff);
  local_a8.val[1] = (double)(byte)(uVar2 >> 8);
  local_a8.val[2] = (double)bVar1;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_40,local_a8.val);
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)(local_80 + 0x20),(double *)f);
  this_00 = (SharedMatting *)local_80;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_80,(double *)b);
  dVar4 = comalpha(this_00,&local_40,(Scalar *)(local_80 + 0x20),(Scalar *)local_80);
  return dVar4 * (1.0 - (pf + pf)) + pf;
}

Assistant:

double SharedMatting::aP(int i, int j, double pf, Scalar f, Scalar b)
{
    int bc = data[i * step + j * channels];
    int gc = data[i * step + j * channels + 1];
    int rc = data[i * step + j * channels + 2];
    Scalar c = Scalar(bc, gc, rc);

    double alpha = comalpha(c, f, b);

    return pf + (1 - 2 * pf) * alpha;
}